

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BackgroundThread.cpp
# Opt level: O2

void __thiscall amrex::BackgroundThread::~BackgroundThread(BackgroundThread *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if ((this->m_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>.
      _M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_BackgroundThread.cpp:13:16)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_BackgroundThread.cpp:13:16)>
               ::_M_manager;
    local_28._M_unused._M_object = this;
    Submit(this,(function<void_()> *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
    std::thread::join();
    std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
              ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)this,(pointer)0x0)
    ;
  }
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->m_func).c);
  std::condition_variable::~condition_variable(&this->m_done_cond);
  std::condition_variable::~condition_variable(&this->m_job_cond);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&this->m_thread);
  return;
}

Assistant:

BackgroundThread::~BackgroundThread ()
{
    if (m_thread) {
        Submit([this] () { m_finalizing = true; });
        m_thread->join();
        m_thread.reset();
    }
}